

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_paramhlp.c
# Opt level: O1

ParameterError add2list(curl_slist **list,char *ptr)

{
  ParameterError PVar1;
  curl_slist *pcVar2;
  
  pcVar2 = (curl_slist *)curl_slist_append(*list);
  if (pcVar2 == (curl_slist *)0x0) {
    PVar1 = PARAM_NO_MEM;
  }
  else {
    *list = pcVar2;
    PVar1 = PARAM_OK;
  }
  return PVar1;
}

Assistant:

ParameterError add2list(struct curl_slist **list, const char *ptr)
{
  struct curl_slist *newlist = curl_slist_append(*list, ptr);
  if(newlist)
    *list = newlist;
  else
    return PARAM_NO_MEM;

  return PARAM_OK;
}